

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void google::protobuf::compiler::java::anon_unknown_6::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  string *psVar1;
  string *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  JavaType JVar7;
  Type TVar8;
  int iVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  ClassNameResolver *name_resolver_00;
  char *pcVar12;
  long *plVar13;
  long lVar14;
  uint uVar15;
  size_type *psVar16;
  size_type *psVar17;
  size_type *psVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int extraout_EDX_37;
  int extraout_EDX_38;
  int extraout_EDX_39;
  int extraout_EDX_40;
  int extraout_EDX_41;
  int extraout_EDX_42;
  int extraout_EDX_43;
  int extraout_EDX_44;
  int extraout_EDX_45;
  undefined8 uVar19;
  FieldDescriptor *pFVar20;
  undefined1 auVar21 [12];
  key_type local_140;
  ClassNameResolver *local_120;
  key_type local_118;
  uint local_f4;
  FieldDescriptor *local_f0;
  undefined1 local_e8 [36];
  uint local_c4;
  key_type local_c0;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string capitalized_type;
  
  local_120 = name_resolver;
  local_f4 = messageBitIndex;
  local_c4 = builderBitIndex;
  SetCommonFieldVariables(descriptor,info,variables);
  local_f0 = descriptor;
  JVar7 = GetJavaType(descriptor);
  pcVar10 = PrimitiveTypeName(JVar7);
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&__str_1.field_2 + 8),"type","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  pcVar12 = (char *)pmVar11->_M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar12,(ulong)pcVar10);
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  pcVar10 = BoxedPrimitiveTypeName(JVar7);
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"boxed_type","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  pcVar12 = (char *)pmVar11->_M_string_length;
  name_resolver_00 = (ClassNameResolver *)strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar12,(ulong)pcVar10);
  psVar16 = &capitalized_type._M_string_length;
  if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  __str_1.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&__str_1.field_2 + 8),"type","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  psVar18 = &__str._M_string_length;
  local_a0 = (undefined1  [8])psVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"field_type","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_a0);
  std::__cxx11::string::_M_assign((string *)pmVar11);
  if (local_a0 != (undefined1  [8])psVar18) {
    operator_delete((void *)local_a0);
  }
  if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  if (JVar7 < JAVATYPE_STRING) {
    pcVar12 = PrimitiveTypeName(JVar7);
    std::__cxx11::string::string
              ((string *)local_a0,pcVar12,(allocator *)(__str.field_2._M_local_buf + 8));
    UnderscoresToCamelCase((string *)((long)&__str_1.field_2 + 8),(string *)local_a0,true);
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str.field_2 + 8),"com.google.protobuf.Internal.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str_1.field_2 + 8));
    plVar13 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      __str._M_string_length = *psVar16;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar16;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"field_list_type","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    psVar16 = &__str_1._M_string_length;
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str.field_2 + 8),"empty",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str_1.field_2 + 8));
    plVar13 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      __str._M_string_length = *psVar17;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar17;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"empty_list","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str.field_2 + 8),"new",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str_1.field_2 + 8));
    plVar13 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      __str._M_string_length = *psVar17;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar17;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"create_list","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str.field_2 + 8),"mutableCopy(",pmVar11);
    plVar13 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      __str._M_string_length = *psVar17;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar17;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    pFVar20 = (FieldDescriptor *)(local_e8 + 0x10);
    local_e8._0_8_ = pFVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"mutable_copy_list","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((FieldDescriptor *)local_e8._0_8_ != pFVar20) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    __str.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&__str.field_2 + 8),"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    local_a0 = (undefined1  [8])psVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(local_a0);
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name_make_immutable","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (__str.field_2._M_local_buf + 8,__str_1.field_2._8_8_);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      __str._M_string_length = *psVar17;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar17;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_e8._0_8_ = pFVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"repeated_get","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((FieldDescriptor *)local_e8._0_8_ != pFVar20) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (__str.field_2._M_local_buf + 8,__str_1.field_2._8_8_);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      __str._M_string_length = *psVar17;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar17;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_e8._0_8_ = pFVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"repeated_add","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((FieldDescriptor *)local_e8._0_8_ != pFVar20) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (__str.field_2._M_local_buf + 8,__str_1.field_2._8_8_);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      __str._M_string_length = *psVar17;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar17;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_e8._0_8_ = pFVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"repeated_set","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)local_a0);
    if ((FieldDescriptor *)local_e8._0_8_ != pFVar20) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    pFVar20 = local_f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    uVar19 = __str_1.field_2._8_8_;
    if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
LAB_0022ca21:
      operator_delete((void *)uVar19);
    }
  }
  else {
    __str.field_2._8_8_ = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str.field_2 + 8),"boxed_type","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "java.util.List<",pmVar11);
    plVar13 = (long *)std::__cxx11::string::append(local_a0);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      capitalized_type._M_string_length = *psVar17;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
      __str_1.field_2._8_8_ = psVar16;
    }
    else {
      capitalized_type._M_string_length = *psVar17;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"field_list_type","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    __str.field_2._8_8_ = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str.field_2 + 8),"boxed_type","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "new java.util.ArrayList<",pmVar11);
    plVar13 = (long *)std::__cxx11::string::append(local_a0);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      capitalized_type._M_string_length = *psVar17;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
      __str_1.field_2._8_8_ = psVar16;
    }
    else {
      capitalized_type._M_string_length = *psVar17;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"create_list","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"boxed_type","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    std::operator+(&local_c0,"new java.util.ArrayList<",pmVar11);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_c0);
    __str.field_2._8_8_ = &__str_1._M_string_length;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      __str_1._M_string_length = *psVar16;
      __str_1.field_2._M_allocated_capacity._0_4_ = (undefined4)plVar13[3];
      __str_1.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
    }
    else {
      __str_1._M_string_length = *psVar16;
      __str.field_2._8_8_ = (size_type *)*plVar13;
    }
    __str_1._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    paVar3 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_118);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (__str.field_2._M_local_buf + 8,(ulong)(pmVar11->_M_dataplus)._M_p);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      __str._M_string_length = *psVar16;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar16;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append(local_a0);
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      capitalized_type._M_string_length = *psVar16;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
    }
    else {
      capitalized_type._M_string_length = *psVar16;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mutable_copy_list","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_140);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    pFVar20 = local_f0;
    if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_);
    }
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str_1.field_2 + 8),"empty_list","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
    name_resolver_00 = (ClassNameResolver *)0x21;
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x2c1174);
    if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    __str.field_2._8_8_ = &__str_1._M_string_length;
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (__str.field_2._M_local_buf + 8,(ulong)(pmVar11->_M_dataplus)._M_p);
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      __str._M_string_length = *psVar16;
      __str.field_2._M_allocated_capacity = plVar13[3];
      local_a0 = (undefined1  [8])psVar18;
    }
    else {
      __str._M_string_length = *psVar16;
      local_a0 = (undefined1  [8])*plVar13;
    }
    __str._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append(local_a0);
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar16) {
      capitalized_type._M_string_length = *psVar16;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
    }
    else {
      capitalized_type._M_string_length = *psVar16;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_118._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"name_make_immutable","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_118);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    psVar16 = &capitalized_type._M_string_length;
    if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    if ((FieldDescriptor *)local_e8._0_8_ != (FieldDescriptor *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((size_type *)__str.field_2._8_8_ != &__str_1._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_a0 = (undefined1  [8])psVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"name","");
    psVar17 = &__str_1._M_string_length;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_a0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str_1.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
    __str.field_2._8_8_ = psVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str.field_2 + 8),"repeated_get","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((size_type *)__str.field_2._8_8_ != psVar17) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    local_a0 = (undefined1  [8])psVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_a0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str_1.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
    __str.field_2._8_8_ = psVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str.field_2 + 8),"repeated_add","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((size_type *)__str.field_2._8_8_ != psVar17) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (local_a0 != (undefined1  [8])psVar18) {
      operator_delete((void *)local_a0);
    }
    local_a0 = (undefined1  [8])psVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_a0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str_1.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str_1.field_2._M_local_buf + 8);
    __str.field_2._8_8_ = psVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str.field_2 + 8),"repeated_set","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((size_type *)__str.field_2._8_8_ != psVar17) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    uVar19 = local_a0;
    if (local_a0 != (undefined1  [8])psVar18) goto LAB_0022ca21;
  }
  psVar16 = &capitalized_type._M_string_length;
  DefaultValue_abi_cxx11_
            ((string *)((long)&__str_1.field_2 + 8),(java *)pFVar20,(FieldDescriptor *)0x1,
             SUB81(local_120,0),name_resolver_00);
  local_a0 = (undefined1  [8])psVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"default","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_a0);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  if (local_a0 != (undefined1  [8])psVar18) {
    operator_delete((void *)local_a0);
  }
  if ((size_type *)__str_1.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  bVar5 = IsDefaultValueJavaDefault(pFVar20);
  if (bVar5) {
    __str_1.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&__str_1.field_2 + 8),"");
  }
  else {
    DefaultValue_abi_cxx11_
              ((string *)local_a0,(java *)pFVar20,(FieldDescriptor *)0x1,SUB81(local_120,0),
               name_resolver_00);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x2a5441);
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      capitalized_type._M_string_length = *psVar17;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
      __str_1.field_2._8_8_ = psVar16;
    }
    else {
      capitalized_type._M_string_length = *psVar17;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
  }
  psVar16 = &__str_1._M_string_length;
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"default_init","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  if ((!bVar5) && (local_a0 != (undefined1  [8])psVar18)) {
    operator_delete((void *)local_a0);
  }
  pcVar10 = GetCapitalizedType(pFVar20,true);
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"capitalized_type","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  pcVar12 = (char *)pmVar11->_M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar12,(ulong)pcVar10);
  pFVar20 = local_f0;
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  iVar9 = *(int *)(pFVar20 + 0x44);
  cVar6 = google::protobuf::FieldDescriptor::is_packed();
  uVar15 = 2;
  if (cVar6 == '\0') {
    if (*(once_flag **)(pFVar20 + 0x30) != (once_flag *)0x0) {
      local_c0._M_dataplus._M_p = (pointer)google::protobuf::FieldDescriptor::TypeOnceInit;
      local_e8._0_8_ = pFVar20;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar20 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_c0,
                 (FieldDescriptor **)local_e8);
    }
    uVar15 = *(uint *)((long)&internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)*(uint *)(pFVar20 + 0x38) * 4);
  }
  psVar18 = &capitalized_type._M_string_length;
  __str_1.field_2._8_8_ = psVar18;
  lVar14 = google::protobuf::FastInt32ToBufferLeft(iVar9 << 3 | uVar15,(char *)psVar18);
  capitalized_type._M_dataplus._M_p = (pointer)(lVar14 - (long)psVar18);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),__str_1.field_2._8_8_,
             capitalized_type._M_dataplus._M_p + __str_1.field_2._8_8_);
  paVar2 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"tag","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  iVar9 = *(int *)(local_f0 + 0x44);
  TVar8 = GetType(local_f0);
  uVar15 = iVar9 * 8 + 1;
  iVar9 = 0x1f;
  if (uVar15 != 0) {
    for (; uVar15 >> iVar9 == 0; iVar9 = iVar9 + -1) {
    }
  }
  psVar18 = &capitalized_type._M_string_length;
  __str_1.field_2._8_8_ = psVar18;
  lVar14 = google::protobuf::FastUInt64ToBufferLeft
                     ((ulong)(iVar9 * 9 + 0x49U >> 6) << (TVar8 == TYPE_GROUP),(char *)psVar18);
  capitalized_type._M_dataplus._M_p = (pointer)(lVar14 - (long)psVar18);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),__str_1.field_2._8_8_,
             capitalized_type._M_dataplus._M_p + __str_1.field_2._8_8_);
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"tag_size","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  JVar7 = GetJavaType(local_f0);
  bVar5 = IsReferenceType(JVar7);
  psVar1 = (string *)((long)&__str_1.field_2 + 8);
  if (bVar5) {
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>(psVar1,"null_check","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x2c11e0);
  }
  else {
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>(psVar1,"null_check","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
    std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x286495);
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  pcVar12 = "";
  if (*(char *)(*(long *)(local_f0 + 0x78) + 0x4e) != '\0') {
    pcVar12 = "@java.lang.Deprecated ";
  }
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"deprecation","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  std::__cxx11::string::_M_replace
            ((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,(ulong)pcVar12);
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  TVar8 = GetType(local_f0);
  iVar9 = FixedSize(TVar8);
  if (iVar9 != -1) {
    psVar18 = &capitalized_type._M_string_length;
    __str_1.field_2._8_8_ = psVar18;
    lVar14 = google::protobuf::FastInt32ToBufferLeft(iVar9,(char *)psVar18);
    capitalized_type._M_dataplus._M_p = (pointer)(lVar14 - (long)psVar18);
    __str.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&__str.field_2 + 8),__str_1.field_2._8_8_,
               capitalized_type._M_dataplus._M_p + __str_1.field_2._8_8_);
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"fixed_size","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((size_type *)__str.field_2._8_8_ != psVar16) {
      operator_delete((void *)__str.field_2._8_8_);
    }
  }
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"on_changed","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x2a9f5a);
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  pFVar20 = local_f0;
  if (*(int *)(local_f0 + 0x3c) != 3) {
    auVar21 = google::protobuf::FieldDescriptor::message_type();
    if (((auVar21._0_8_ != 0) || (pFVar20[0x41] != (FieldDescriptor)0x0)) ||
       (*(int *)(*(long *)(pFVar20 + 0x28) + 0x3c) == 2)) {
      GenerateGetBit_abi_cxx11_
                ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)local_f4,auVar21._8_4_);
      __str.field_2._8_8_ = psVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&__str.field_2 + 8),"get_has_field_bit_message","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
      iVar9 = extraout_EDX;
      if ((size_type *)__str.field_2._8_8_ != psVar16) {
        operator_delete((void *)__str.field_2._8_8_);
        iVar9 = extraout_EDX_00;
      }
      if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
        operator_delete((void *)__str_1.field_2._8_8_);
        iVar9 = extraout_EDX_01;
      }
      GenerateGetBit_abi_cxx11_
                ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)local_c4,iVar9);
      __str.field_2._8_8_ = psVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&__str.field_2 + 8),"get_has_field_bit_builder","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
      iVar9 = extraout_EDX_02;
      if ((size_type *)__str.field_2._8_8_ != psVar16) {
        operator_delete((void *)__str.field_2._8_8_);
        iVar9 = extraout_EDX_03;
      }
      if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
        operator_delete((void *)__str_1.field_2._8_8_);
        iVar9 = extraout_EDX_04;
      }
      __return_storage_ptr__ = (string *)(__str.field_2._M_local_buf + 8);
      GenerateSetBit_abi_cxx11_(__return_storage_ptr__,(java *)(ulong)local_f4,iVar9);
      plVar13 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
      psVar18 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar18) {
        capitalized_type._M_string_length = *psVar18;
        capitalized_type.field_2._M_allocated_capacity = plVar13[3];
      }
      else {
        capitalized_type._M_string_length = *psVar18;
        __str_1.field_2._8_8_ = (size_type *)*plVar13;
      }
      capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
      *plVar13 = (long)psVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"set_has_field_bit_message","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_c0);
      std::__cxx11::string::operator=
                ((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
      iVar9 = extraout_EDX_05;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p);
        iVar9 = extraout_EDX_06;
      }
      if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
        operator_delete((void *)__str_1.field_2._8_8_);
        iVar9 = extraout_EDX_07;
      }
      if ((size_type *)__str.field_2._8_8_ != psVar16) {
        operator_delete((void *)__str.field_2._8_8_);
        iVar9 = extraout_EDX_08;
      }
      GenerateSetBit_abi_cxx11_(__return_storage_ptr__,(java *)(ulong)local_c4,iVar9);
      plVar13 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
      psVar18 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar18) {
        capitalized_type._M_string_length = *psVar18;
        capitalized_type.field_2._M_allocated_capacity = plVar13[3];
      }
      else {
        capitalized_type._M_string_length = *psVar18;
        __str_1.field_2._8_8_ = (size_type *)*plVar13;
      }
      capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
      *plVar13 = (long)psVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"set_has_field_bit_builder","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_c0);
      std::__cxx11::string::operator=
                ((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
      iVar9 = extraout_EDX_09;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p);
        iVar9 = extraout_EDX_10;
      }
      if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
        operator_delete((void *)__str_1.field_2._8_8_);
        iVar9 = extraout_EDX_11;
      }
      if ((size_type *)__str.field_2._8_8_ != psVar16) {
        operator_delete((void *)__str.field_2._8_8_);
        iVar9 = extraout_EDX_12;
      }
      GenerateClearBit_abi_cxx11_(__return_storage_ptr__,(java *)(ulong)local_c4,iVar9);
      plVar13 = (long *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
      psVar18 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar18) {
        capitalized_type._M_string_length = *psVar18;
        capitalized_type.field_2._M_allocated_capacity = plVar13[3];
      }
      else {
        capitalized_type._M_string_length = *psVar18;
        __str_1.field_2._8_8_ = (size_type *)*plVar13;
      }
      capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
      *plVar13 = (long)psVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"clear_has_field_bit_builder","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_c0);
      std::__cxx11::string::operator=
                ((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
      iVar9 = extraout_EDX_13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p);
        iVar9 = extraout_EDX_14;
      }
      uVar15 = local_c4;
      if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
        operator_delete((void *)__str_1.field_2._8_8_);
        iVar9 = extraout_EDX_15;
      }
      if ((size_type *)__str.field_2._8_8_ != psVar16) {
        operator_delete((void *)__str.field_2._8_8_);
        iVar9 = extraout_EDX_16;
      }
      GenerateGetBit_abi_cxx11_
                ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)local_f4,iVar9);
      __str.field_2._8_8_ = psVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&__str.field_2 + 8),"is_field_present_message","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
      iVar9 = extraout_EDX_17;
      if ((size_type *)__str.field_2._8_8_ != psVar16) {
        operator_delete((void *)__str.field_2._8_8_);
        iVar9 = extraout_EDX_18;
      }
      if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
        operator_delete((void *)__str_1.field_2._8_8_);
        iVar9 = extraout_EDX_19;
      }
      goto LAB_0022d698;
    }
  }
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"set_has_field_bit_message","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x286495);
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"set_has_field_bit_builder","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x286495);
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"clear_has_field_bit_builder","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str_1.field_2 + 8));
  std::__cxx11::string::_M_replace((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,0x286495);
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  pFVar20 = local_f0;
  if (*(once_flag **)(local_f0 + 0x30) != (once_flag *)0x0) {
    __str_1.field_2._8_8_ = google::protobuf::FieldDescriptor::TypeOnceInit;
    __str.field_2._8_8_ = local_f0;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(local_f0 + 0x30),
               (_func_void_FieldDescriptor_ptr **)((long)&__str_1.field_2 + 8),
               (FieldDescriptor **)((long)&__str.field_2 + 8));
  }
  if (*(int *)(pFVar20 + 0x38) == 0xc) {
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__str.field_2 + 8),"!",pmVar11);
    plVar13 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar18) {
      capitalized_type._M_string_length = *psVar18;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
    }
    else {
      capitalized_type._M_string_length = *psVar18;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_e8._0_8_ = (FieldDescriptor *)(local_e8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"is_field_present_message","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    iVar9 = extraout_EDX_20;
    if ((FieldDescriptor *)local_e8._0_8_ != (FieldDescriptor *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
      iVar9 = extraout_EDX_21;
    }
    uVar19 = __str_1.field_2._8_8_;
    if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
LAB_0022d66e:
      operator_delete((void *)uVar19);
      iVar9 = extraout_EDX_22;
    }
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_c0);
    pcVar4 = (pmVar11->_M_dataplus)._M_p;
    __str.field_2._8_8_ = psVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str.field_2 + 8),pcVar4,pcVar4 + pmVar11->_M_string_length);
    std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    local_e8._0_8_ = (FieldDescriptor *)(local_e8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"default","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e8);
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (__str.field_2._M_local_buf + 8,(ulong)(pmVar11->_M_dataplus)._M_p);
    __str_1.field_2._8_8_ = &capitalized_type._M_string_length;
    psVar18 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar18) {
      capitalized_type._M_string_length = *psVar18;
      capitalized_type.field_2._M_allocated_capacity = plVar13[3];
    }
    else {
      capitalized_type._M_string_length = *psVar18;
      __str_1.field_2._8_8_ = (size_type *)*plVar13;
    }
    capitalized_type._M_dataplus._M_p = (pointer)plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"is_field_present_message","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_118);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
    iVar9 = extraout_EDX_43;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
      iVar9 = extraout_EDX_44;
    }
    if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
      operator_delete((void *)__str_1.field_2._8_8_);
      iVar9 = extraout_EDX_45;
    }
    uVar19 = local_e8._0_8_;
    if ((FieldDescriptor *)local_e8._0_8_ != (FieldDescriptor *)(local_e8 + 0x10))
    goto LAB_0022d66e;
  }
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_23;
  }
  uVar15 = local_c4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
    uVar15 = local_c4;
    iVar9 = extraout_EDX_24;
  }
LAB_0022d698:
  GenerateGetBit_abi_cxx11_((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)uVar15,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"get_mutable_bit_builder","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  iVar9 = extraout_EDX_25;
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_26;
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
    iVar9 = extraout_EDX_27;
  }
  GenerateSetBit_abi_cxx11_((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)uVar15,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"set_mutable_bit_builder","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  iVar9 = extraout_EDX_28;
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_29;
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
    iVar9 = extraout_EDX_30;
  }
  GenerateClearBit_abi_cxx11_((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)uVar15,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"clear_mutable_bit_builder","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  iVar9 = extraout_EDX_31;
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_32;
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
    iVar9 = extraout_EDX_33;
  }
  GenerateGetBitMutableLocal_abi_cxx11_
            ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)uVar15,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"get_mutable_bit_parser","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  iVar9 = extraout_EDX_34;
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_35;
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
    iVar9 = extraout_EDX_36;
  }
  GenerateSetBitMutableLocal_abi_cxx11_
            ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)uVar15,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"set_mutable_bit_parser","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  iVar9 = extraout_EDX_37;
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_38;
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
    iVar9 = extraout_EDX_39;
  }
  GenerateGetBitFromLocal_abi_cxx11_
            ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)uVar15,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"get_has_field_bit_from_local","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  iVar9 = extraout_EDX_40;
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
    iVar9 = extraout_EDX_41;
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
    iVar9 = extraout_EDX_42;
  }
  GenerateSetBitToLocal_abi_cxx11_
            ((string *)((long)&__str_1.field_2 + 8),(java *)(ulong)local_f4,iVar9);
  __str.field_2._8_8_ = psVar16;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"set_has_field_bit_to_local","");
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)((long)&__str.field_2 + 8));
  std::__cxx11::string::operator=((string *)pmVar11,(string *)(__str_1.field_2._M_local_buf + 8));
  if ((size_type *)__str.field_2._8_8_ != psVar16) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if ((size_type *)__str_1.field_2._8_8_ != &capitalized_type._M_string_length) {
    operator_delete((void *)__str_1.field_2._8_8_);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           int messageBitIndex, int builderBitIndex,
                           const FieldGeneratorInfo* info,
                           ClassNameResolver* name_resolver,
                           std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);
  JavaType javaType = GetJavaType(descriptor);

  (*variables)["type"] = PrimitiveTypeName(javaType);
  (*variables)["boxed_type"] = BoxedPrimitiveTypeName(javaType);
  (*variables)["field_type"] = (*variables)["type"];

  if (javaType == JAVATYPE_BOOLEAN || javaType == JAVATYPE_DOUBLE ||
      javaType == JAVATYPE_FLOAT || javaType == JAVATYPE_INT ||
      javaType == JAVATYPE_LONG) {
    std::string capitalized_type = UnderscoresToCamelCase(
        PrimitiveTypeName(javaType), /*cap_first_letter=*/true);
    (*variables)["field_list_type"] =
        "com.google.protobuf.Internal." + capitalized_type + "List";
    (*variables)["empty_list"] = "empty" + capitalized_type + "List()";
    (*variables)["create_list"] = "new" + capitalized_type + "List()";
    (*variables)["mutable_copy_list"] =
        "mutableCopy(" + (*variables)["name"] + "_)";
    (*variables)["name_make_immutable"] =
        (*variables)["name"] + "_.makeImmutable()";
    (*variables)["repeated_get"] =
        (*variables)["name"] + "_.get" + capitalized_type;
    (*variables)["repeated_add"] =
        (*variables)["name"] + "_.add" + capitalized_type;
    (*variables)["repeated_set"] =
        (*variables)["name"] + "_.set" + capitalized_type;
  } else {
    (*variables)["field_list_type"] =
        "java.util.List<" + (*variables)["boxed_type"] + ">";
    (*variables)["create_list"] =
        "new java.util.ArrayList<" + (*variables)["boxed_type"] + ">()";
    (*variables)["mutable_copy_list"] = "new java.util.ArrayList<" +
                                        (*variables)["boxed_type"] + ">(" +
                                        (*variables)["name"] + "_)";
    (*variables)["empty_list"] = "java.util.Collections.emptyList()";
    (*variables)["name_make_immutable"] =
        (*variables)["name"] + "_ = java.util.Collections.unmodifiableList(" +
        (*variables)["name"] + "_)";
    (*variables)["repeated_get"] = (*variables)["name"] + "_.get";
    (*variables)["repeated_add"] = (*variables)["name"] + "_.add";
    (*variables)["repeated_set"] = (*variables)["name"] + "_.set";
  }

  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_init"] =
      IsDefaultValueJavaDefault(descriptor)
          ? ""
          : ("= " + ImmutableDefaultValue(descriptor, name_resolver));
  (*variables)["capitalized_type"] =
      GetCapitalizedType(descriptor, /* immutable = */ true);
  (*variables)["tag"] =
      StrCat(static_cast<int32>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  if (IsReferenceType(GetJavaType(descriptor))) {
    (*variables)["null_check"] =
        "  if (value == null) {\n"
        "    throw new NullPointerException();\n"
        "  }\n";
  } else {
    (*variables)["null_check"] = "";
  }
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  int fixed_size = FixedSize(GetType(descriptor));
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = StrCat(fixed_size);
  }
  (*variables)["on_changed"] = "onChanged();";

  if (SupportFieldPresence(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    if (descriptor->type() == FieldDescriptor::TYPE_BYTES) {
      (*variables)["is_field_present_message"] =
          "!" + (*variables)["name"] + "_.isEmpty()";
    } else {
      (*variables)["is_field_present_message"] =
          (*variables)["name"] + "_ != " + (*variables)["default"];
    }
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);
}